

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O2

bool tinyusdz::pathutil::ResolveRelativePath
               (Path *base_prim_path,Path *relative_path,Path *abs_path,string *err)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_dirs;
  string remainder;
  string abs_dir;
  string relative_str;
  string base_str;
  allocator local_1b9;
  string *local_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  Path *local_130;
  Path *local_128;
  string local_120;
  Path local_100;
  
  if (abs_path == (Path *)0x0) {
    return false;
  }
  ::std::__cxx11::string::string((string *)&local_150,(string *)relative_path);
  ::std::__cxx11::string::string((string *)&local_120,(string *)base_prim_path);
  ::std::__cxx11::string::string((string *)&local_100,"/",(allocator *)&local_1b0);
  bVar1 = startsWith(&local_120,&local_100._prim_part);
  ::std::__cxx11::string::_M_dispose();
  if (!bVar1) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar1 = false;
    goto LAB_001a3cc5;
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&local_100,"./",(allocator *)&local_1b0);
  bVar1 = startsWith(&local_150,&local_100._prim_part);
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
joined_r0x001a3a11:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_001a3c2e:
    bVar1 = false;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_100,"../",(allocator *)&local_1b0);
    bVar1 = startsWith(&local_150,&local_100._prim_part);
    ::std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      ::std::__cxx11::string::string((string *)&local_100,".",(allocator *)&local_1b0);
      bVar1 = startsWith(&local_150,&local_100._prim_part);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) {
        ::std::__cxx11::string::string((string *)&local_100,"/",(allocator *)&local_1b0);
        bVar1 = startsWith(&local_150,&local_100._prim_part);
        ::std::__cxx11::string::_M_dispose();
        if (bVar1) {
          ::std::__cxx11::string::_M_assign((string *)&local_170);
        }
        else {
          ::std::operator+(&local_1b0,&local_120,"/");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_150);
          ::std::__cxx11::string::operator=((string *)&local_170,(string *)&local_100);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        goto LAB_001a3c8a;
      }
      goto joined_r0x001a3a11;
    }
    local_1b8 = err;
    local_130 = relative_path;
    local_128 = abs_path;
    ::std::__cxx11::string::string((string *)&local_190,(string *)&local_150);
    for (uVar2 = 0; uVar2 < 0x100000 || local_190._M_string_length != 0; uVar2 = uVar2 + 1) {
      ::std::__cxx11::string::string((string *)&local_100,"../",(allocator *)&local_1b0);
      bVar1 = startsWith(&local_190,&local_100._prim_part);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) break;
      ::std::__cxx11::string::string((string *)&local_1b0,"../",&local_1b9);
      removePrefix(&local_100._prim_part,&local_190,&local_1b0);
      ::std::__cxx11::string::operator=((string *)&local_190,(string *)&local_100);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::string((string *)&local_100,".",(allocator *)&local_1b0);
    bVar1 = contains_str((string *)&local_190,(string *)&local_100);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      if (local_1b8 != (string *)0x0) {
        ::std::__cxx11::string::append((char *)local_1b8);
      }
LAB_001a3c24:
      ::std::__cxx11::string::_M_dispose();
      goto LAB_001a3c2e;
    }
    ::std::__cxx11::string::string((string *)&local_100,"/",&local_1b9);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_1b0,(string *)&local_120,(string *)&local_100,0x147ae14);
    ::std::__cxx11::string::_M_dispose();
    if (local_1b0._M_string_length - (long)local_1b0._M_dataplus._M_p == 0) {
      ::std::operator+(&local_100._prim_part,"/",&local_190);
      ::std::__cxx11::string::operator=((string *)&local_170,(string *)&local_100);
    }
    else {
      uVar4 = (long)(local_1b0._M_string_length - (long)local_1b0._M_dataplus._M_p) >> 5;
      if ((long)(uVar4 - uVar2) < -1) {
        if (local_1b8 != (string *)0x0) {
          ::std::__cxx11::string::append((char *)local_1b8);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1b0);
        goto LAB_001a3c24;
      }
      if (0 < (long)(uVar4 - uVar2)) {
        lVar3 = 0;
        for (; uVar2 != uVar4; uVar4 = uVar4 - 1) {
          ::std::operator+(&local_100._prim_part,"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_1b0._M_dataplus._M_p + lVar3));
          ::std::__cxx11::string::append((string *)&local_170);
          ::std::__cxx11::string::_M_dispose();
          lVar3 = lVar3 + 0x20;
        }
      }
      ::std::operator+(&local_100._prim_part,"/",&local_190);
      ::std::__cxx11::string::append((string *)&local_170);
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b0);
    ::std::__cxx11::string::_M_dispose();
    relative_path = local_130;
    abs_path = local_128;
LAB_001a3c8a:
    Path::Path(&local_100,&local_170,(string *)&relative_path->_prop_part);
    Path::operator=(abs_path,&local_100);
    Path::~Path(&local_100);
    bVar1 = true;
  }
  ::std::__cxx11::string::_M_dispose();
LAB_001a3cc5:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool ResolveRelativePath(const Path &base_prim_path, const Path &relative_path, Path *abs_path, std::string *err) {

  if (!abs_path) {
    return false;
  }

  std::string relative_str = relative_path.prim_part();
  std::string base_str = base_prim_path.prim_part();

  // base_prim_path must be absolute.
  if (startsWith(base_str, "/")) {
    // ok
  } else {
    if (err) {
      (*err) += "Base Prim path is not absolute path.\n";
    }
    return false;
  }

  std::string abs_dir;

  if (startsWith(relative_str, "./")) {
    // pxrUSD doesn't allow "./", so do same in tinyusdz.
#if 1
    if (err) {
      (*err) += "Path starting with `./` is not allowed.\n";
    }
    return false;
#else
    std::string remainder = removePrefix(relative_str, "./");

    // "./../", "././", etc is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      return false;
    }

    abs_dir = base_str + "/" + remainder;
#endif

  } else if (startsWith(relative_str, "../")) {
    // ok
    size_t ndepth{0};
    std::string remainder = RemoveRelativePrefix(relative_str, ndepth);
    DCOUT("remainder = " << remainder << ", ndepth = " << ndepth);

    // "../" in subsequent position(e.g. `../bora/../dora`) is not allowed at the moment.
    if (contains_str(remainder, ".")) {
      if (err) {
        (*err) += "`../` in the middle of Path is not allowed.\n";
      }
      return false;
    }

    std::vector<std::string> base_dirs = split(base_str, "/");
    DCOUT("base_dirs.len = " << base_dirs.size());
    //if (base_dirs.size() < ndepth) {
    //  return false;
    //}

    if (base_dirs.size() == 0) { // "/"
      abs_dir = "/" + remainder;
    } else {
      int64_t n = int64_t(base_dirs.size()) - int64_t(ndepth);

#if 1
      // pxrUSD behavior
      if (n < -1) {
        if (err) {
          (*err) += "The number of `../` exceeds Prim path depth.\n";
        }
        return false;
      }
#else
      // Unixish path behavior
#endif
      if (n <= 0) {
        abs_dir += "/" + remainder;
      } else {
        for (size_t i = 0; i < size_t(n); i++) {
          abs_dir += "/" + base_dirs[i];
        }
        abs_dir += "/" + remainder;
      }
    }
  } else if (startsWith(relative_str, ".")) {
    // Property path?
    if (err) {
      (*err) += "A path starting with `.` is not allowed for Prim path.\n";
    }
    return false;
  } else if (startsWith(relative_str, "/")) {
    // Input path is already absolute.
    abs_dir = relative_str;
  } else {
    // Guess relative path(e.g. "muda", "bora/dora")
    // TODO: Check Path contains valid characters.
    abs_dir = base_str + "/" + relative_str;
  }

  (*abs_path) = Path(abs_dir, relative_path.prop_part());

  return true;
}